

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_cs.cpp
# Opt level: O2

CallResultWrap * tapi_query(void *h,char *account_id,char *command,char *data)

{
  CallResultWrap *this;
  char *pcVar1;
  CallResult<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> r;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  CallResult<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  if (h != (void *)0x0) {
    std::__cxx11::string::string(local_68,account_id,&local_a9);
    std::__cxx11::string::string(local_88,command,&local_aa);
    std::__cxx11::string::string(local_a8,data,&local_ab);
    (**(code **)(*h + 0x68))(&local_48,h,local_68,local_88,local_a8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
    this = (CallResultWrap *)operator_new(0x10c);
    CallResultWrap::CallResultWrap(this);
    if (local_48.value.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (string *)0x0) {
      pcVar1 = _T(&local_48.msg,&this->_msg);
      this->msg = pcVar1;
    }
    else {
      pcVar1 = _T(local_48.value.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,&this->text);
      this->value = pcVar1;
      this->value_type = 5;
    }
    tquant::api::
    CallResult<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~CallResult(&local_48);
    return this;
  }
  __assert_fail("tapi",
                "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/c/api/tqapi_cs.cpp"
                ,0x1b7,
                "CallResultWrap *tapi_query(void *, const char *, const char *, const char *)");
}

Assistant:

_TQAPI_EXPORT
CallResultWrap* tapi_query(void* h, const char* account_id, const char* command, const char* data)
{
    auto tapi = reinterpret_cast<TradeApi*>(h);
    assert(tapi);

    auto r = tapi->query(account_id, command, data);
    CallResultWrap* cr = new CallResultWrap();
    if (r.value) {
		cr->value = _T(*r.value, cr->text);
        cr->value_type = VT_STRING;
    }
    else {
        cr->msg = _T(r.msg, cr->_msg);
    }
    return cr;
}